

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::RuntimeImp::stop(RuntimeImp *this,InstanceId instanceId)

{
  bool bVar1;
  Instance *pIVar2;
  IllegalArgumentException *pIVar3;
  UnsupportedOperationException *this_00;
  lock_guard<chatra::SpinLock> local_50;
  lock_guard<chatra::SpinLock> lock1;
  Package *package;
  lock_guard<chatra::SpinLock> local_30;
  lock_guard<chatra::SpinLock> lock0;
  PackageId primaryPackageId;
  Instance *instance;
  InstanceId instanceId_local;
  RuntimeImp *this_local;
  
  instance = (Instance *)instanceId;
  instanceId_local = (InstanceId)this;
  pIVar2 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef(&this->instanceIds,instanceId);
  if (pIVar2 == (Instance *)0x0) {
    pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
    memset(pIVar3,0,0x28);
    IllegalArgumentException::IllegalArgumentException(pIVar3);
    __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  lock0._M_device = (mutex_type *)pIVar2->primaryPackageId;
  if (lock0._M_device == (mutex_type *)0xffffffffffffffff) {
    pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
    memset(pIVar3,0,0x28);
    IllegalArgumentException::IllegalArgumentException(pIVar3);
    __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_30,&pIVar2->lockThreads);
  bVar1 = std::
          unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
          ::empty(&pIVar2->threads);
  if (!bVar1) {
    this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
    (this_00->super_NativeException).message._M_string_length = 0;
    (this_00->super_NativeException).message.field_2._M_allocated_capacity = 0;
    *(undefined8 *)&this_00->super_NativeException = 0;
    *(undefined8 *)&(this_00->super_NativeException).message = 0;
    *(undefined8 *)((long)&(this_00->super_NativeException).message.field_2 + 8) = 0;
    UnsupportedOperationException::UnsupportedOperationException(this_00);
    __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
                UnsupportedOperationException::~UnsupportedOperationException);
  }
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_30);
  lock1._M_device =
       (mutex_type *)
       IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                 (&this->packageIds,pIVar2->primaryPackageId);
  std::lock_guard<chatra::SpinLock>::lock_guard
            (&local_50,&((Package *)lock1._M_device)->lockInstances);
  std::
  unordered_map<chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>,_std::hash<chatra::InstanceId>,_std::equal_to<chatra::InstanceId>,_std::allocator<std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>_>_>
  ::erase((unordered_map<chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>,_std::hash<chatra::InstanceId>,_std::equal_to<chatra::InstanceId>,_std::allocator<std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>_>_>
           *)(lock1._M_device + 0xe8),(key_type *)&instance);
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_50);
  return;
}

Assistant:

void RuntimeImp::stop(InstanceId instanceId) {
	auto* instance = instanceIds.lockAndRef(instanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	auto primaryPackageId = instance->primaryPackageId;
	if (primaryPackageId == enum_max<PackageId>::value)
		throw IllegalArgumentException();

	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		if (!instance->threads.empty())
			throw UnsupportedOperationException();
	}

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	chatra_assert(package != nullptr);
	{
		std::lock_guard<SpinLock> lock1(package->lockInstances);
		package->instances.erase(instanceId);
	}
}